

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  undefined8 uVar2;
  Message MVar3;
  int iVar4;
  size_t sVar5;
  CapturedStream **in_RDX;
  ostream *poVar6;
  char *pcVar7;
  uint uVar8;
  ostream *poVar9;
  bool bVar10;
  undefined1 local_90 [8];
  string error_message;
  long local_68;
  long local_60;
  Message local_50;
  Message buffer;
  regmatch_t match;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStream_abi_cxx11_((string *)local_90,(internal *)&g_captured_stderr,in_RDX);
  Message::Message(&local_50);
  poVar6 = (ostream *)((long)local_50.ss_.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Death test: ",0xc);
  pcVar7 = this->statement_;
  if (pcVar7 == (char *)0x0) {
    sVar5 = 6;
    pcVar7 = "(null)";
  }
  else {
    sVar5 = strlen(pcVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      if (this->regex_[8] == (RE)0x1) {
        iVar4 = regexec((regex_t *)(this->regex_ + 0x50),(char *)local_90,1,(regmatch_t *)&buffer,0)
        ;
        bVar10 = iVar4 == 0;
      }
      else {
        bVar10 = false;
      }
      if (bVar10 == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"    Result: died but not with expected error.\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  Expected: ",0xc);
        pcVar7 = *(char **)this->regex_;
        if (pcVar7 == (char *)0x0) {
          sVar5 = 6;
          pcVar7 = "(null)";
        }
        else {
          sVar5 = strlen(pcVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Actual msg:\n",0xc);
        FormatDeathTestOutput((string *)&buffer,(string *)local_90);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)buffer.ss_.ptr_,(long)match);
        if (buffer.ss_.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38) {
          operator_delete((void *)buffer.ss_.ptr_,local_38._M_allocated_capacity + 1);
        }
      }
      goto LAB_001733f7;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    Result: died but not with expected exit code:\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"            ",0xc);
    uVar1 = this->status_;
    Message::Message((Message *)((long)&error_message.field_2 + 8));
    uVar8 = uVar1 & 0x7f;
    if (uVar8 == 0) {
      poVar9 = (ostream *)(error_message.field_2._8_8_ + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Exited with exit status ",0x18);
      std::ostream::operator<<(poVar9,uVar1 >> 8 & 0xff);
    }
    else if (0x1ffffff < (int)(uVar8 * 0x1000000 + 0x1000000)) {
      poVar9 = (ostream *)(error_message.field_2._8_8_ + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Terminated by signal ",0x15);
      std::ostream::operator<<(poVar9,uVar8);
    }
    if ((char)uVar1 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(error_message.field_2._8_8_ + 0x10)," (core dumped)",0xe);
    }
    uVar2 = error_message.field_2._8_8_;
    StringStreamToString((string *)&buffer,(stringstream *)error_message.field_2._8_8_);
    if (uVar2 != 0) {
      (**(code **)(*(long *)uVar2 + 8))(uVar2);
      error_message.field_2._8_8_ = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)buffer.ss_.ptr_,(long)match);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Actual msg:\n",0xc);
    FormatDeathTestOutput((string *)((long)&error_message.field_2 + 8),(string *)local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(char *)error_message.field_2._8_8_,local_68);
    if ((long *)error_message.field_2._8_8_ != &stack0xffffffffffffffa0) {
      operator_delete((void *)error_message.field_2._8_8_,local_60 + 1);
    }
    break;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)&buffer,(string *)local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)buffer.ss_.ptr_,(long)match);
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    Result: illegal return in test statement.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)&buffer,(string *)local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)buffer.ss_.ptr_,(long)match);
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)&buffer,(string *)local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)buffer.ss_.ptr_,(long)match);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&buffer,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                       ,0x246);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&buffer);
    goto LAB_001733f4;
  }
  if (buffer.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38) {
    operator_delete((void *)buffer.ss_.ptr_,local_38._M_allocated_capacity + 1);
  }
LAB_001733f4:
  bVar10 = false;
LAB_001733f7:
  MVar3.ss_.ptr_ = local_50.ss_.ptr_;
  StringStreamToString((string *)&buffer,(stringstream *)local_50.ss_.ptr_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DeathTest::last_death_test_message__abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer);
  if (buffer.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38) {
    operator_delete((void *)buffer.ss_.ptr_,local_38._M_allocated_capacity + 1);
  }
  if (MVar3.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)MVar3.ss_.ptr_ + 8))(MVar3.ss_.ptr_);
    local_50.ss_.ptr_ =
         (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if (local_90 != (undefined1  [8])&error_message._M_string_length) {
    operator_delete((void *)local_90,error_message._M_string_length + 1);
  }
  return bVar10;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}